

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall kj::str<signed_char&>(String *__return_storage_ptr__,kj *this,char *params)

{
  undefined8 in_RAX;
  size_t size;
  String *result;
  char *__dest;
  CappedArray<char,_5UL> CVar1;
  undefined8 local_18;
  
  local_18._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  CVar1 = _::Stringifier::operator*((Stringifier *)&_::STR,(char)*this);
  size = CVar1.currentSize;
  local_18._0_5_ = CVar1.content;
  heapString(__return_storage_ptr__,size);
  if (size != 0) {
    __dest = (char *)(__return_storage_ptr__->content).size_;
    if (__dest != (char *)0x0) {
      __dest = (__return_storage_ptr__->content).ptr;
    }
    memcpy(__dest,&local_18,size);
  }
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}